

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setControlDesiredPoint
          (L2NormCost *this,VectorDynSize *desiredPoint)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  CostAttributes *this_00;
  long in_RDI;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> newTrajectory;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *__r;
  VectorDynSize *in_stack_ffffffffffffffb8;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> local_28 [2];
  byte local_1;
  
  bVar1 = CostAttributes::isValid((CostAttributes *)(*(long *)(in_RDI + 0x28) + 0x128));
  if (bVar1) {
    uVar3 = iDynTree::VectorDynSize::size();
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x34c23e);
    uVar2 = Selector::size((Selector *)0x34c246);
    if (uVar3 == uVar2) {
      __r = local_28;
      std::
      make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,iDynTree::VectorDynSize_const&>
                (in_stack_ffffffffffffffb8);
      this_00 = (CostAttributes *)(*(long *)(in_RDI + 0x28) + 0x128);
      std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>>::
      shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,void>
                ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                  *)this_00,__r);
      local_1 = CostAttributes::setDesiredTrajectory
                          (this_00,(shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                                    *)__r);
      std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
      ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
                   *)0x34c2db);
      std::shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_>::
      ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_>
                   *)0x34c2e5);
    }
    else {
      iDynTree::reportError
                ("L2NormCost","setControlDesiredPoint",
                 "The desiredPoint size do not match the dimension of the specified selector.");
      local_1 = 0;
    }
  }
  else {
    iDynTree::reportError
              ("L2NormCost","setControlDesiredPoint",
               "The control cost portion has been deactivated, given the provided selectors.");
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool L2NormCost::setControlDesiredPoint(const VectorDynSize &desiredPoint)
        {
            if (!(m_pimpl->controlCost.isValid())) {
                reportError("L2NormCost", "setControlDesiredPoint", "The control cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (desiredPoint.size() != (m_pimpl->controlCost.selector->size())) {
                reportError("L2NormCost", "setControlDesiredPoint", "The desiredPoint size do not match the dimension of the specified selector.");
                return false;
            }

            std::shared_ptr<TimeInvariantVector> newTrajectory = std::make_shared<TimeInvariantVector>(desiredPoint);
            return m_pimpl->controlCost.setDesiredTrajectory(newTrajectory);
        }